

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O2

bool __thiscall
wasm::Match::Internal::
Matcher<wasm::Unary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::UnaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
::matches(Matcher<wasm::Unary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::UnaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
          *this,candidate_t<wasm::Unary_*> candidate)

{
  bool bVar1;
  
  if (candidate->_id == UnaryId) {
    if (this->binder != (matched_t<wasm::Unary_*> *)0x0) {
      *this->binder = (matched_t<wasm::Unary_*>)candidate;
    }
    bVar1 = Components<wasm::Unary_*,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::UnaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
            ::match((matched_t<wasm::Unary_*>)candidate,&this->submatchers);
    return bVar1;
  }
  return false;
}

Assistant:

inline bool matches(candidate_t<Kind> candidate) {
    matched_t<Kind> casted;
    if (dynCastCandidate<Kind>(candidate, casted)) {
      if (binder != nullptr) {
        *binder = casted;
      }
      return MatchSelf<Kind>{}(casted, data) &&
             Components<Kind, 0, Matchers...>::match(casted, submatchers);
    }
    return false;
  }